

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::DummyBinding::Bind
          (BindResult *__return_storage_ptr__,DummyBinding *this,LambdaRefExpression *lambdaref,
          idx_t depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  reference args_1;
  InternalException *this_00;
  pointer *__ptr;
  key_type *__k;
  ColumnBinding binding;
  Expression *local_98;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  key_type local_88;
  idx_t local_68;
  ColumnBinding local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __k = &local_88;
  local_68 = depth;
  (*(lambdaref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])(__k,lambdaref)
  ;
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&(this->super_Binding).name_map,__k);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    __k = *(key_type **)
           ((long)iVar2.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                  ._M_cur + 0x28);
  }
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    local_60.table_index = (this->super_Binding).index;
    local_60.column_index = (idx_t)__k;
    (*(lambdaref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_88,lambdaref);
    args_1 = vector<duckdb::LogicalType,_true>::operator[]
                       (&(this->super_Binding).types,(size_type)__k);
    make_uniq<duckdb::BoundLambdaRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&,unsigned_long&,unsigned_long&>
              ((duckdb *)&local_98,&local_88,args_1,&local_60,&lambdaref->lambda_idx,&local_68);
    local_90._M_head_impl = local_98;
    local_98 = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_90);
    if (local_90._M_head_impl != (Expression *)0x0) {
      (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_90._M_head_impl = (Expression *)0x0;
    if (local_98 != (Expression *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
    local_98 = (Expression *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"Column %s not found in bindings","");
  (*(lambdaref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
            (&local_50,lambdaref);
  InternalException::InternalException<std::__cxx11::string>(this_00,&local_88,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BindResult DummyBinding::Bind(LambdaRefExpression &lambdaref, idx_t depth) {
	column_t column_index;
	if (!TryGetBindingIndex(lambdaref.GetName(), column_index)) {
		throw InternalException("Column %s not found in bindings", lambdaref.GetName());
	}
	ColumnBinding binding(index, column_index);
	return BindResult(make_uniq<BoundLambdaRefExpression>(lambdaref.GetName(), types[column_index], binding,
	                                                      lambdaref.lambda_idx, depth));
}